

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

bool __thiscall
HPresolve::removeColumnSingletonInDoubletonInequality(HPresolve *this,int col,int i,int k)

{
  int *piVar1;
  stack<double,_std::deque<double,_std::allocator<double>_>_> *this_00;
  stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
  *this_01;
  iterator *piVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  double *pdVar7;
  double *pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  _Elt_pointer pcVar12;
  ulong uVar13;
  ostream *poVar14;
  pointer pdVar15;
  long *plVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int col_00;
  ulong uVar21;
  int iVar22;
  int iVar23;
  pair<double,_double> pVar24;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  timeval tv;
  vector<double,_std::allocator<double>_> bndsJ;
  vector<double,_std::allocator<double>_> bndsCol;
  pair<int,_std::vector<double,_std::allocator<double>_>_> local_c8;
  ulong local_a8;
  ulong local_a0;
  vector<double,_std::allocator<double>_> local_98;
  pair<int,_double> local_78;
  vector<double,_std::allocator<double>_> local_68;
  ulong local_50;
  double local_48;
  double local_40;
  ulong local_38;
  
  uVar19 = (ulong)(uint)i;
  uVar21 = (ulong)i;
  piVar4 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar17 = (long)(this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
  uVar13 = uVar21;
  if ((uVar21 < uVar17) && (uVar13 = (ulong)(i + 1), local_50 = uVar19, uVar13 < uVar17)) {
    iVar23 = piVar4[uVar21];
    uVar19 = (ulong)iVar23;
    iVar3 = piVar4[uVar13];
    col_00 = -1;
    iVar22 = iVar3;
    if (iVar3 < iVar23) {
      iVar22 = iVar23;
    }
    if (iVar23 < iVar3) {
      piVar4 = (this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar18 = (long)(this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
      piVar5 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar17 = (long)(this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
      uVar20 = uVar19;
      do {
        if (uVar18 <= uVar20) {
          uVar17 = uVar18;
          uVar13 = uVar19;
          if (uVar19 < uVar18) {
            uVar13 = uVar18;
          }
          goto LAB_00141c01;
        }
        col_00 = piVar4[uVar20];
        uVar13 = (ulong)col_00;
        if (uVar17 <= uVar13) goto LAB_00141c01;
        if ((col_00 != col) && (piVar5[uVar13] != 0)) {
          iVar22 = (int)uVar20;
          break;
        }
        uVar20 = uVar20 + 1;
      } while ((long)iVar22 != uVar20);
    }
    if (iVar22 == iVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ERROR: nzRow[",0xd);
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_50);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"]=2, but no second variable in row. \n",0x25);
    }
    pdVar15 = (this->super_HPreData).rowLower.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar17 = (long)(this->super_HPreData).rowLower.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar15 >> 3;
    uVar13 = uVar21;
    if (uVar21 < uVar17) {
      pdVar6 = (this->super_HPreData).rowUpper.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar17 = (long)(this->super_HPreData).rowUpper.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar6 >> 3;
      if (uVar21 < uVar17) {
        if (ABS(pdVar15[uVar21] - pdVar6[uVar21]) < this->tol) {
          uVar13 = (ulong)col_00;
          piVar4 = (this->super_HPreData).nzCol.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar17 = (long)(this->super_HPreData).nzCol.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
          if (uVar17 <= uVar13) goto LAB_00141c01;
          if (1 < piVar4[uVar13]) {
            return false;
          }
        }
        local_38 = uVar21;
        gettimeofday((timeval *)&local_c8,(__timezone_ptr_t)0x0);
        (this->timer).itemStart[8] =
             (double)(long)local_c8.second.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start / 1000000.0 +
             (double)(long)local_c8._0_8_;
        uVar19 = (ulong)iVar22;
        pdVar15 = (this->super_HPreData).ARvalue.super__Vector_base<double,_std::allocator<double>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar17 = (long)(this->super_HPreData).ARvalue.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar15 >> 3;
        uVar13 = uVar19;
        if (uVar19 < uVar17) {
          uVar21 = (ulong)k;
          pdVar6 = (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar17 = (long)(this->super_HPreData).Avalue.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar6 >> 3;
          uVar13 = uVar21;
          if (uVar21 < uVar17) {
            iVar23 = (int)local_50;
            pVar24 = getNewBoundsDoubletonConstraint
                               (this,iVar23,col_00,(int)pdVar6,pdVar15[uVar19],pdVar6[uVar21]);
            uVar20 = (ulong)col;
            pdVar15 = (this->super_HPreData).colLower.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar17 = (long)(this->super_HPreData).colLower.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar15 >> 3;
            uVar13 = uVar20;
            if (uVar20 < uVar17) {
              if (pVar24.first < pdVar15[uVar20]) {
LAB_0014131a:
                gettimeofday((timeval *)&local_c8,(__timezone_ptr_t)0x0);
                (this->timer).itemTicks[8] =
                     (((double)(long)local_c8.second.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start / 1000000.0 +
                      (double)(long)local_c8._0_8_) - (this->timer).itemStart[8]) +
                     (this->timer).itemTicks[8];
                return false;
              }
              pdVar15 = (this->super_HPreData).colUpper.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar17 = (long)(this->super_HPreData).colUpper.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pdVar15 >> 3;
              if (uVar20 < uVar17) {
                if (pdVar15[uVar20] < pVar24.second) goto LAB_0014131a;
                pdVar15 = (this->super_HPreData).ARvalue.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                uVar17 = (long)(this->super_HPreData).ARvalue.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pdVar15 >> 3;
                uVar13 = uVar19;
                local_a8 = uVar21;
                if (uVar19 < uVar17) {
                  this_00 = &(this->super_HPreData).postValue;
                  pdVar8 = pdVar15 + uVar19;
                  pdVar7 = (this->super_HPreData).postValue.c.
                           super__Deque_base<double,_std::allocator<double>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_cur;
                  local_a0 = uVar19;
                  if (pdVar7 == *(_Elt_pointer *)
                                 ((long)&(this->super_HPreData).postValue.c.
                                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                         super__Deque_impl_data._M_finish + 0x10) + -1) {
                    std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                              ((deque<double,std::allocator<double>> *)this_00,pdVar8);
                  }
                  else {
                    *pdVar7 = *pdVar8;
                    (this->super_HPreData).postValue.c.
                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur = pdVar7 + 1;
                  }
                  pdVar15 = (this->super_HPreData).Avalue.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar17 = (long)(this->super_HPreData).Avalue.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar15 >> 3;
                  uVar13 = local_a8;
                  if (local_a8 < uVar17) {
                    pdVar8 = (this->super_HPreData).postValue.c.
                             super__Deque_base<double,_std::allocator<double>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_cur;
                    if (pdVar8 == *(_Elt_pointer *)
                                   ((long)&(this->super_HPreData).postValue.c.
                                           super__Deque_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Deque_impl_data._M_finish + 0x10) + -1) {
                      std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                                ((deque<double,std::allocator<double>> *)this_00,pdVar15 + local_a8)
                      ;
                      pdVar15 = (this->super_HPreData).Avalue.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      uVar17 = (long)(this->super_HPreData).Avalue.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar15 >> 3;
                    }
                    else {
                      *pdVar8 = pdVar15[local_a8];
                      (this->super_HPreData).postValue.c.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur = pdVar8 + 1;
                    }
                    uVar13 = local_a8;
                    if (local_a8 < uVar17) {
                      pdVar6 = (this->super_HPreData).ARvalue.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      uVar17 = (long)(this->super_HPreData).ARvalue.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar6 >> 3;
                      uVar13 = local_a0;
                      if (local_a0 < uVar17) {
                        pVar24 = getNewBoundsDoubletonConstraint
                                           (this,iVar23,col,(int)pdVar6,pdVar15[local_a8],
                                            pdVar6[local_a0]);
                        local_48 = pVar24.second;
                        local_40 = pVar24.first;
                        if (this->iKKTcheck == 1) {
                          local_c8._0_8_ = (pointer)0x0;
                          local_c8.second.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          local_c8.second.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          uVar19 = (ulong)col_00;
                          pdVar15 = (this->super_HPreData).colLower.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start;
                          if ((ulong)((long)(this->super_HPreData).colLower.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)pdVar15 >> 3) <= uVar19) {
                            std::__throw_out_of_range_fmt
                                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                       ,uVar19);
                          }
                          local_78.second = pdVar15[uVar19];
                          local_78.first = col_00;
                          std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
                          _M_realloc_insert<std::pair<int,double>>
                                    ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>
                                      *)&local_c8,(iterator)0x0,&local_78);
                          pdVar15 = (this->super_HPreData).colUpper.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start;
                          if ((ulong)((long)(this->super_HPreData).colUpper.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)pdVar15 >> 3) <= uVar19) {
                            std::__throw_out_of_range_fmt
                                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                       ,uVar19);
                          }
                          local_78.second = pdVar15[uVar19];
                          if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish ==
                              local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
                            local_78.first = col_00;
                            std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>
                            ::_M_realloc_insert<std::pair<int,double>>
                                      ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>
                                        *)&local_68,
                                       (iterator)
                                       local_68.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_finish,&local_78);
                          }
                          else {
                            local_78.second._4_4_ = (undefined4)((ulong)local_78.second >> 0x20);
                            *(int *)local_68.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish = col_00;
                            *(undefined4 *)
                             ((long)local_68.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 4) = local_78._4_4_;
                            *(undefined4 *)
                             ((long)local_68.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 8) =
                                 local_78.second._0_4_;
                            *(undefined4 *)
                             ((long)((long)local_68.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish + 8) + 4) =
                                 local_78.second._4_4_;
                            local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((long)local_68.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish + 0x10);
                            local_78.first = col_00;
                          }
                          pdVar15 = (this->super_HPreData).colCost.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start;
                          if ((ulong)((long)(this->super_HPreData).colCost.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)pdVar15 >> 3) <= uVar19) {
                            std::__throw_out_of_range_fmt
                                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                       ,uVar19);
                          }
                          local_78.second = pdVar15[uVar19];
                          if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish ==
                              local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
                            local_78.first = col_00;
                            std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>
                            ::_M_realloc_insert<std::pair<int,double>>
                                      ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>
                                        *)&local_98,
                                       (iterator)
                                       local_98.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_finish,&local_78);
                          }
                          else {
                            *local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish =
                                 (double)CONCAT44(local_78._4_4_,col_00);
                            *(double *)
                             ((long)local_98.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 8) = local_78.second
                            ;
                            local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((long)local_98.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish + 0x10);
                            local_78.first = col_00;
                          }
                          std::
                          deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                          ::push_back(&(this->super_HPreData).chk.cLowers.c,(value_type *)&local_c8)
                          ;
                          std::
                          deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                          ::push_back(&(this->super_HPreData).chk.cUppers.c,(value_type *)&local_68)
                          ;
                          std::
                          deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                          ::push_back(&(this->super_HPreData).chk.costs.c,(value_type *)&local_98);
                          if ((pair<int,_double> *)
                              local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start != (pair<int,_double> *)0x0) {
                            operator_delete(local_98.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                          }
                          if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_68.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                          }
                          if ((pointer)local_c8._0_8_ != (pointer)0x0) {
                            operator_delete((void *)local_c8._0_8_);
                          }
                        }
                        pdVar15 = (this->super_HPreData).colLower.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        uVar17 = (long)(this->super_HPreData).colLower.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pdVar15 >> 3;
                        uVar13 = uVar20;
                        if (uVar20 < uVar17) {
                          local_c8._0_8_ = pdVar15[uVar20];
                          pdVar15 = (this->super_HPreData).colUpper.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start;
                          uVar17 = (long)(this->super_HPreData).colUpper.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish - (long)pdVar15 >> 3;
                          if (uVar20 < uVar17) {
                            local_c8.second.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start = (pointer)pdVar15[uVar20];
                            pdVar15 = (this->super_HPreData).colCost.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start;
                            uVar17 = (long)(this->super_HPreData).colCost.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish - (long)pdVar15
                                     >> 3;
                            if (uVar20 < uVar17) {
                              local_c8.second.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish = (pointer)pdVar15[uVar20];
                              __l._M_len = 3;
                              __l._M_array = (iterator)&local_c8;
                              std::vector<double,_std::allocator<double>_>::vector
                                        (&local_68,__l,(allocator_type *)&local_98);
                              uVar19 = (ulong)col_00;
                              pdVar15 = (this->super_HPreData).colLower.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start;
                              if (uVar19 < (ulong)((long)(this->super_HPreData).colLower.
                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar15 >> 3)) {
                                local_c8._0_8_ = pdVar15[uVar19];
                                pdVar15 = (this->super_HPreData).colUpper.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start;
                                if (uVar19 < (ulong)((long)(this->super_HPreData).colUpper.
                                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar15 >> 3)) {
                                  local_c8.second.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start = (pointer)pdVar15[uVar19];
                                  pdVar15 = (this->super_HPreData).colCost.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start;
                                  if (uVar19 < (ulong)((long)(this->super_HPreData).colCost.
                                                                                                                          
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar15 >> 3)) {
                                    local_c8.second.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish = (pointer)pdVar15[uVar19];
                                    __l_00._M_len = 3;
                                    __l_00._M_array = (iterator)&local_c8;
                                    std::vector<double,_std::allocator<double>_>::vector
                                              (&local_98,__l_00,(allocator_type *)&local_78);
                                    local_c8.first = col;
                                    std::vector<double,_std::allocator<double>_>::vector
                                              (&local_c8.second,&local_68);
                                    this_01 = &(this->super_HPreData).oldBounds;
                                    std::
                                    deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
                                    ::
                                    emplace_back<std::pair<int,std::vector<double,std::allocator<double>>>>
                                              ((deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
                                                *)this_01,&local_c8);
                                    if ((pointer)local_c8.second.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start !=
                                        (pointer)0x0) {
                                      operator_delete(local_c8.second.
                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                    }
                                    local_c8.first = col_00;
                                    std::vector<double,_std::allocator<double>_>::vector
                                              (&local_c8.second,&local_98);
                                    std::
                                    deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
                                    ::
                                    emplace_back<std::pair<int,std::vector<double,std::allocator<double>>>>
                                              ((deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
                                                *)this_01,&local_c8);
                                    if ((pointer)local_c8.second.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start !=
                                        (pointer)0x0) {
                                      operator_delete(local_c8.second.
                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                    }
                                    pdVar15 = (this->super_HPreData).colLower.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start;
                                    uVar17 = uVar19;
                                    if (uVar19 < (ulong)((long)(this->super_HPreData).colLower.
                                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar15 >> 3)) {
                                      if (pdVar15[uVar19] <= local_40 && local_40 != pdVar15[uVar19]
                                         ) {
                                        pdVar15[uVar19] = local_40;
                                      }
                                      pdVar6 = (this->super_HPreData).colUpper.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_start;
                                      if (uVar19 < (ulong)((long)(this->super_HPreData).colUpper.
                                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar6 >> 3)) {
                                        if (local_48 < pdVar6[uVar19]) {
                                          pdVar6[uVar19] = local_48;
                                        }
                                        pdVar9 = (this->super_HPreData).colCost.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start;
                                        uVar13 = (long)(this->super_HPreData).colCost.
                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                 (long)pdVar9 >> 3;
                                        if ((((uVar19 < uVar13) &&
                                             (uVar17 = uVar20, uVar20 < uVar13)) &&
                                            (pdVar10 = (this->super_HPreData).ARvalue.
                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                            uVar17 = local_a0,
                                            local_a0 <
                                            (ulong)((long)(this->super_HPreData).ARvalue.
                                                                                                                    
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar10 >> 3))) &&
                                           (pdVar11 = (this->super_HPreData).Avalue.
                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                           uVar17 = local_a8,
                                           local_a8 <
                                           (ulong)((long)(this->super_HPreData).Avalue.
                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar11 >> 3))) {
                                          pdVar9[uVar19] =
                                               pdVar9[uVar19] -
                                               (pdVar9[uVar20] * pdVar10[local_a0]) /
                                               pdVar11[local_a8];
                                          if (local_98.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_finish ==
                                              local_98.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start) {
                                            uVar17 = 0;
                                          }
                                          else {
                                            *local_98.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start =
                                                 pdVar15[uVar19];
                                            if ((ulong)((long)local_98.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_98.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) <
                                                2) {
                                              uVar17 = 1;
                                            }
                                            else {
                                              *(double *)
                                               ((long)local_98.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 8) =
                                                   pdVar6[uVar19];
                                              if ((long)local_98.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_98.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start == 0x10)
                                              {
                                                uVar17 = 2;
                                              }
                                              else {
                                                *(double *)
                                                 ((long)local_98.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 0x10)
                                                     = pdVar9[uVar19];
                                                std::vector<double,_std::allocator<double>_>::vector
                                                          (&local_c8.second,&local_98);
                                                std::
                                                deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
                                                ::
                                                emplace_back<std::pair<int,std::vector<double,std::allocator<double>>>>
                                                          ((
                                                  deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
                                                  *)this_01,&local_c8);
                                                if ((pointer)local_c8.second.
                                                                                                                          
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                  operator_delete(local_c8.second.
                                                                                                                                    
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                }
                                                if (0 < this->iPrint) {
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             "PR: Column singleton ",0x15);
                                                  poVar14 = (ostream *)
                                                            std::ostream::operator<<
                                                                      ((ostream *)&std::cout,col);
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            (poVar14,
                                                  " in a doubleton inequality constraint removed. Row "
                                                  ,0x33);
                                                  poVar14 = (ostream *)
                                                            std::ostream::operator<<(poVar14,iVar23)
                                                  ;
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            (poVar14," removed. variable left is ",
                                                             0x1b);
                                                  plVar16 = (long *)std::ostream::operator<<
                                                                              (poVar14,col_00);
                                                  std::ios::widen((char)*(undefined8 *)
                                                                         (*plVar16 + -0x18) +
                                                                  (char)plVar16);
                                                  std::ostream::put((char)plVar16);
                                                  std::ostream::flush();
                                                }
                                                piVar4 = (this->super_HPreData).flagCol.
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start;
                                                uVar17 = uVar20;
                                                if (uVar20 < (ulong)((long)(this->super_HPreData).
                                                                           flagCol.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)piVar4 >> 2)) {
                                                  piVar4[uVar20] = 0;
                                                  fillStackRowBounds(this,iVar23);
                                                  piVar1 = (this->countRemovedCols).
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 8;
                                                  *piVar1 = *piVar1 + 1;
                                                  piVar1 = (this->countRemovedRows).
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 8;
                                                  *piVar1 = *piVar1 + 1;
                                                  pdVar15 = (this->super_HPreData).valueColDual.
                                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  if (uVar20 < (ulong)((long)(this->super_HPreData).
                                                                             valueColDual.
                                                                                                                                                          
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar15 >> 3)) {
                                                    pdVar15[uVar20] = 0.0;
                                                    pdVar15 = (this->super_HPreData).colCost.
                                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  if (((uVar20 < (ulong)((long)(this->super_HPreData
                                                                               ).colCost.
                                                                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar15 >> 3)) &&
                                                  (pdVar6 = (this->super_HPreData).Avalue.
                                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  uVar17 = local_a8,
                                                  local_a8 <
                                                  (ulong)((long)(this->super_HPreData).Avalue.
                                                                                                                                
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar6 >> 3))) &&
                                                  (pdVar9 = (this->super_HPreData).valueRowDual.
                                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  uVar17 = local_38,
                                                  local_38 <
                                                  (ulong)((long)(this->super_HPreData).valueRowDual.
                                                                                                                                
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar9 >> 3))) {
                                                    pdVar9[local_38] =
                                                         -pdVar15[uVar20] / pdVar6[local_a8];
                                                    local_c8._4_4_ = iVar23;
                                                    local_c8.first = 8;
                                                    local_c8.second.
                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)CONCAT44(local_c8.second.
                                                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  col);
                                                  pcVar12 = (this->super_HPreData).chng.c.
                                                                                                                        
                                                  super__Deque_base<change,_std::allocator<change>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                                                  if (pcVar12 ==
                                                      *(_Elt_pointer *)
                                                       ((long)&(this->super_HPreData).chng.c.
                                                                                                                              
                                                  super__Deque_base<change,_std::allocator<change>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish + 0x10)
                                                  + -1) {
                                                    std::deque<change,std::allocator<change>>::
                                                    _M_push_back_aux<change_const&>
                                                              ((deque<change,std::allocator<change>>
                                                                *)&(this->super_HPreData).chng,
                                                               (change *)&local_c8);
                                                  }
                                                  else {
                                                    pcVar12->col = col;
                                                    pcVar12->type = 8;
                                                    pcVar12->row = iVar23;
                                                    piVar2 = &(this->super_HPreData).chng.c.
                                                                                                                            
                                                  super__Deque_base<change,_std::allocator<change>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish;
                                                  piVar2->_M_cur = piVar2->_M_cur + 1;
                                                  }
                                                  piVar4 = (this->super_HPreData).nzCol.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start;
                                                  uVar17 = uVar19;
                                                  if (uVar19 < (ulong)((long)(this->super_HPreData).
                                                                             nzCol.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)piVar4 >> 2)) {
                                                    iVar3 = piVar4[uVar19];
                                                    if (iVar3 < 2) {
                                                      if (iVar3 == 1) {
                                                        removeSecondColumnSingletonInDoubletonRow
                                                                  (this,col_00,iVar23);
                                                      }
                                                    }
                                                    else {
                                                      removeRow(this,iVar23);
                                                    }
                                                    gettimeofday((timeval *)&local_c8,
                                                                 (__timezone_ptr_t)0x0);
                                                    (this->timer).itemTicks[8] =
                                                         (((double)(long)local_c8.second.
                                                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start /
                                                  1000000.0 + (double)(long)local_c8._0_8_) -
                                                  (this->timer).itemStart[8]) +
                                                  (this->timer).itemTicks[8];
                                                  if ((pair<int,_double> *)
                                                      local_98.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pair<int,_double> *)0x0) {
                                                    operator_delete(local_98.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_68.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_68.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  return true;
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                    std::__throw_out_of_range_fmt
                                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                               ,uVar17);
                                  }
                                }
                              }
                              std::__throw_out_of_range_fmt
                                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                         ,uVar19);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00141c01:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar13,
             uVar17);
}

Assistant:

bool HPresolve::removeColumnSingletonInDoubletonInequality(const int col, const int i, const int k) {
	//second column index j
	//second column row array index kk
	int j = -1;

	//count
	int kk = ARstart.at(i);
	while (kk<ARstart.at(i+1)) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j!=col)
			break;
		else
			++kk;
	}
	if (kk==ARstart.at(i+1))
		cout<<"ERROR: nzRow["<< i<< "]=2, but no second variable in row. \n";

	//only inequality case and case two singletons here,
	//others handled in doubleton equation
	if ((abs(rowLower.at(i) - rowUpper.at(i)) < tol) && (nzCol.at(j) > 1))
		return false;

	timer.recordStart(SING_COL_DOUBLETON_INEQ);
	// additional check if it is indeed implied free
	// needed since we handle inequalities and it may not be true
	// low and upp to be tighter than original bounds for variable col
	// so it is indeed implied free and we can remove it
	pair<double, double> p = getNewBoundsDoubletonConstraint(i, j, col, ARvalue.at(kk), Avalue.at(k));
	if (!(colLower.at(col) <= p.first && colUpper.at(col) >= p.second)) {
		timer.recordFinish(SING_COL_DOUBLETON_INEQ);
		return false;
	}

	postValue.push(ARvalue.at(kk));
	postValue.push(Avalue.at(k));

	//modify bounds on variable j, variable col (k) is substituted out
	//double aik = Avalue.at(k);
	//double aij = Avalue.at(kk);
	p = getNewBoundsDoubletonConstraint(i, col, j, Avalue.at(k), ARvalue.at(kk));
	double low = p.first;
	double upp = p.second;

	//add old bounds of xj to checker and for postsolve
	if (iKKTcheck == 1) {
		vector<pair<int, double> > bndsL, bndsU, costS;
		bndsL.push_back( make_pair( j, colLower.at(j)));
		bndsU.push_back( make_pair( j, colUpper.at(j)));
		costS.push_back( make_pair( j, colCost.at(j)));
		chk.cLowers.push(bndsL);
		chk.cUppers.push(bndsU);
		chk.costs.push(costS);
	}

	vector<double> bndsCol({colLower.at(col), colUpper.at(col), colCost.at(col)});
	vector<double> bndsJ({colLower.at(j), colUpper.at(j), colCost.at(j)});
	oldBounds.push(make_pair( col, bndsCol));
	oldBounds.push(make_pair( j, bndsJ));

	//modify bounds of xj
	if (low > colLower.at(j))
		colLower.at(j) = low;
	if (upp < colUpper.at(j))
		colUpper.at(j) = upp;

	//modify cost of xj
	colCost.at(j) = colCost.at(j) - colCost.at(col)*ARvalue.at(kk)/Avalue.at(k);

	//for postsolve: need the new bounds too
	//oldBounds.push_back(colLower.at(j)); oldBounds.push_back(colUpper.at(j));
	bndsJ.at(0) = (colLower.at(j));
	bndsJ.at(1) = (colUpper.at(j));
	bndsJ.at(2) = (colCost.at(j));
	oldBounds.push(make_pair( j, bndsJ));

	//remove col as free column singleton
	if (iPrint > 0)
		cout<<"PR: Column singleton "<<col<<" in a doubleton inequality constraint removed. Row "<<i<<" removed. variable left is "<<j<<endl;

	flagCol.at(col) = 0;
	fillStackRowBounds(i);
	countRemovedCols[SING_COL_DOUBLETON_INEQ]++;
	countRemovedRows[SING_COL_DOUBLETON_INEQ]++;

	valueColDual.at(col) = 0;
	valueRowDual.at(i) = -colCost.at(col)/Avalue.at(k); //may be changed later, depending on bounds.
	addChange(SING_COL_DOUBLETON_INEQ, i, col);

	//if not special case two column singletons
	if (nzCol.at(j) > 1)
		removeRow(i);
	else if (nzCol.at(j)==1)
		removeSecondColumnSingletonInDoubletonRow(j, i);

	timer.recordFinish(SING_COL_DOUBLETON_INEQ);
	return true;
}